

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_export.c
# Opt level: O0

REF_STATUS ref_export_bin_ugrid_int(FILE *file,REF_BOOL swap,REF_BOOL fat,REF_INT output)

{
  long lVar1;
  long lVar2;
  size_t sVar3;
  REF_LONG ref_private_status_reis_bi_1;
  REF_LONG ref_private_status_reis_ai_1;
  char *yp_1;
  char *xp_1;
  int y_1;
  REF_INT actual_1;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  char *yp;
  char *xp;
  long y;
  REF_LONG actual;
  REF_BOOL local_20;
  REF_INT output_local;
  REF_BOOL fat_local;
  REF_BOOL swap_local;
  FILE *file_local;
  
  lVar1 = y;
  y._0_1_ = (undefined1)output;
  actual._4_4_ = output;
  local_20 = fat;
  output_local = swap;
  _fat_local = file;
  if (fat == 0) {
    xp_1._4_4_ = output;
    if (swap != 0) {
      xp_1._3_1_ = (undefined1)y;
      xp_1._5_1_ = (undefined1)((uint)output >> 8);
      xp_1._2_1_ = xp_1._5_1_;
      xp_1._6_1_ = (undefined1)((uint)output >> 0x10);
      xp_1._1_1_ = xp_1._6_1_;
      xp_1._7_1_ = (undefined1)((uint)output >> 0x18);
      xp_1._0_1_ = xp_1._7_1_;
      xp_1._4_4_ = (REF_INT)xp_1;
    }
    sVar3 = fwrite((void *)((long)&xp_1 + 4),4,1,(FILE *)file);
    if (sVar3 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
             0x616,"ref_export_bin_ugrid_int","output int",1,sVar3);
      return 1;
    }
  }
  else {
    lVar2 = (long)output;
    if (swap != 0) {
      yp = (char *)&y;
      ref_private_status_reis_ai = (REF_LONG)&xp;
      xp._7_1_ = (undefined1)y;
      y._1_1_ = SUB81(lVar1,1);
      xp._6_1_ = y._1_1_;
      y._2_1_ = SUB81(lVar1,2);
      xp._5_1_ = y._2_1_;
      y._3_1_ = SUB81(lVar1,3);
      xp._4_1_ = y._3_1_;
      y._4_1_ = SUB81(lVar1,4);
      xp._3_1_ = y._4_1_;
      y._5_1_ = SUB81(lVar1,5);
      xp._2_1_ = y._5_1_;
      y._6_1_ = SUB81(lVar1,6);
      xp._1_1_ = y._6_1_;
      y._7_1_ = SUB81(lVar1,7);
      xp._0_1_ = y._7_1_;
      y = (long)xp;
      lVar2 = y;
    }
    y = lVar2;
    ref_private_status_reis_bi = 1;
    _y_1 = fwrite(&y,8,1,(FILE *)file);
    if (ref_private_status_reis_bi != _y_1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
             0x611,"ref_export_bin_ugrid_int","output long",ref_private_status_reis_bi,_y_1);
      return 1;
    }
  }
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_export_bin_ugrid_int(FILE *file, REF_BOOL swap,
                                                   REF_BOOL fat,
                                                   REF_INT output) {
  if (fat) {
    REF_LONG actual;
    actual = (REF_LONG)output;
    if (swap) SWAP_LONG(actual);
    REIS(1, fwrite(&actual, sizeof(REF_LONG), 1, file), "output long");
  } else {
    REF_INT actual;
    actual = output;
    if (swap) SWAP_INT(actual);
    REIS(1, fwrite(&actual, sizeof(REF_INT), 1, file), "output int");
  }
  return REF_SUCCESS;
}